

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

test * __thiscall leveldb::test::RandomKey_abi_cxx11_(test *this,Random *rnd,int len)

{
  uint32_t uVar1;
  int local_24;
  int i;
  int len_local;
  Random *rnd_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
    uVar1 = Random::Uniform(rnd,10);
    std::__cxx11::string::operator+=((string *)this,""[uVar1]);
  }
  return this;
}

Assistant:

std::string RandomKey(Random* rnd, int len) {
  // Make sure to generate a wide variety of characters so we
  // test the boundary conditions for short-key optimizations.
  static const char kTestChars[] = {'\0', '\1', 'a',    'b',    'c',
                                    'd',  'e',  '\xfd', '\xfe', '\xff'};
  std::string result;
  for (int i = 0; i < len; i++) {
    result += kTestChars[rnd->Uniform(sizeof(kTestChars))];
  }
  return result;
}